

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowAboutWindow(bool *p_open)

{
  ImFontAtlas *pIVar1;
  bool bVar2;
  ImGuiID id;
  ImVec2 in_RAX;
  char *pcVar3;
  ImGuiIO *pIVar4;
  ImGuiStyle *pIVar5;
  float fVar6;
  ImVec2 child_size;
  ImVec2 local_28;
  
  local_28 = in_RAX;
  bVar2 = Begin("About Dear ImGui",p_open,0x40);
  if (bVar2) {
    pcVar3 = GetVersion();
    Text("Dear ImGui %s",pcVar3);
    Separator();
    Text("By Omar Cornut and all Dear ImGui contributors.");
    Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");
    Checkbox("Config/Build Information",&ShowAboutWindow::show_config_info);
    if (ShowAboutWindow::show_config_info == true) {
      pIVar4 = GetIO();
      pIVar5 = GetStyle();
      local_28.x = 0.0;
      local_28.y = 0.0;
      bVar2 = Button("Copy to clipboard",&local_28);
      fVar6 = GetTextLineHeightWithSpacing();
      local_28 = (ImVec2)((ulong)(uint)(fVar6 * 18.0) << 0x20);
      id = GetID("cfg_infos");
      BeginChildFrame(id,&local_28,4);
      if (bVar2) {
        LogToClipboard(-1);
        LogText("```\n");
      }
      Text("Dear ImGui %s (%d)","1.85",0x4845);
      Separator();
      Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d",8,2,0x14);
      Text("define: __cplusplus=%d",0x3118f);
      Text("define: __linux__");
      Text("define: __GNUC__=%d",4);
      Text("define: __clang_version__=%s",
           "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
      Text("define: IMGUI_HAS_VIEWPORT");
      Text("define: IMGUI_HAS_DOCK");
      Separator();
      pcVar3 = pIVar4->BackendPlatformName;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = "NULL";
      }
      Text("io.BackendPlatformName: %s",pcVar3);
      pcVar3 = pIVar4->BackendRendererName;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = "NULL";
      }
      Text("io.BackendRendererName: %s",pcVar3);
      Text("io.ConfigFlags: 0x%08X",(ulong)(uint)pIVar4->ConfigFlags);
      if ((pIVar4->ConfigFlags & 1) != 0) {
        Text(" NavEnableKeyboard");
      }
      if ((pIVar4->ConfigFlags & 2) != 0) {
        Text(" NavEnableGamepad");
      }
      if ((pIVar4->ConfigFlags & 4) != 0) {
        Text(" NavEnableSetMousePos");
      }
      if ((pIVar4->ConfigFlags & 8) != 0) {
        Text(" NavNoCaptureKeyboard");
      }
      if ((pIVar4->ConfigFlags & 0x10) != 0) {
        Text(" NoMouse");
      }
      if ((pIVar4->ConfigFlags & 0x20) != 0) {
        Text(" NoMouseCursorChange");
      }
      if ((pIVar4->ConfigFlags & 0x40) != 0) {
        Text(" DockingEnable");
      }
      if ((pIVar4->ConfigFlags & 0x400) != 0) {
        Text(" ViewportsEnable");
      }
      if ((pIVar4->ConfigFlags & 0x4000) != 0) {
        Text(" DpiEnableScaleViewports");
      }
      if ((pIVar4->ConfigFlags & 0x8000) != 0) {
        Text(" DpiEnableScaleFonts");
      }
      if (pIVar4->MouseDrawCursor == true) {
        Text("io.MouseDrawCursor");
      }
      if (pIVar4->ConfigViewportsNoAutoMerge == true) {
        Text("io.ConfigViewportsNoAutoMerge");
      }
      if (pIVar4->ConfigViewportsNoTaskBarIcon == true) {
        Text("io.ConfigViewportsNoTaskBarIcon");
      }
      if (pIVar4->ConfigViewportsNoDecoration == true) {
        Text("io.ConfigViewportsNoDecoration");
      }
      if (pIVar4->ConfigViewportsNoDefaultParent == true) {
        Text("io.ConfigViewportsNoDefaultParent");
      }
      if (pIVar4->ConfigDockingNoSplit == true) {
        Text("io.ConfigDockingNoSplit");
      }
      if (pIVar4->ConfigDockingWithShift == true) {
        Text("io.ConfigDockingWithShift");
      }
      if (pIVar4->ConfigDockingAlwaysTabBar == true) {
        Text("io.ConfigDockingAlwaysTabBar");
      }
      if (pIVar4->ConfigDockingTransparentPayload == true) {
        Text("io.ConfigDockingTransparentPayload");
      }
      if (pIVar4->ConfigMacOSXBehaviors == true) {
        Text("io.ConfigMacOSXBehaviors");
      }
      if (pIVar4->ConfigInputTextCursorBlink == true) {
        Text("io.ConfigInputTextCursorBlink");
      }
      if (pIVar4->ConfigWindowsResizeFromEdges == true) {
        Text("io.ConfigWindowsResizeFromEdges");
      }
      if (pIVar4->ConfigWindowsMoveFromTitleBarOnly == true) {
        Text("io.ConfigWindowsMoveFromTitleBarOnly");
      }
      if (0.0 <= pIVar4->ConfigMemoryCompactTimer) {
        Text("io.ConfigMemoryCompactTimer = %.1f",(double)pIVar4->ConfigMemoryCompactTimer);
      }
      Text("io.BackendFlags: 0x%08X",(ulong)(uint)pIVar4->BackendFlags);
      if ((pIVar4->BackendFlags & 1) != 0) {
        Text(" HasGamepad");
      }
      if ((pIVar4->BackendFlags & 2) != 0) {
        Text(" HasMouseCursors");
      }
      if ((pIVar4->BackendFlags & 4) != 0) {
        Text(" HasSetMousePos");
      }
      if ((pIVar4->BackendFlags & 0x400) != 0) {
        Text(" PlatformHasViewports");
      }
      if ((pIVar4->BackendFlags & 0x800) != 0) {
        Text(" HasMouseHoveredViewport");
      }
      if ((pIVar4->BackendFlags & 8) != 0) {
        Text(" RendererHasVtxOffset");
      }
      if ((pIVar4->BackendFlags & 0x1000) != 0) {
        Text(" RendererHasViewports");
      }
      Separator();
      pIVar1 = pIVar4->Fonts;
      Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d",(ulong)(uint)(pIVar1->Fonts).Size,
           (ulong)(uint)pIVar1->Flags,(ulong)(uint)pIVar1->TexWidth,(ulong)(uint)pIVar1->TexHeight);
      Text("io.DisplaySize: %.2f,%.2f",(double)(pIVar4->DisplaySize).x,
           (double)(pIVar4->DisplaySize).y);
      Text("io.DisplayFramebufferScale: %.2f,%.2f",(double)(pIVar4->DisplayFramebufferScale).x,
           (double)(pIVar4->DisplayFramebufferScale).y);
      Separator();
      Text("style.WindowPadding: %.2f,%.2f",(double)(pIVar5->WindowPadding).x,
           (double)(pIVar5->WindowPadding).y);
      Text("style.WindowBorderSize: %.2f",(double)pIVar5->WindowBorderSize);
      Text("style.FramePadding: %.2f,%.2f",(double)(pIVar5->FramePadding).x,
           (double)(pIVar5->FramePadding).y);
      Text("style.FrameRounding: %.2f",(double)pIVar5->FrameRounding);
      Text("style.FrameBorderSize: %.2f",(double)pIVar5->FrameBorderSize);
      Text("style.ItemSpacing: %.2f,%.2f",(double)(pIVar5->ItemSpacing).x,
           (double)(pIVar5->ItemSpacing).y);
      Text("style.ItemInnerSpacing: %.2f,%.2f",(double)(pIVar5->ItemInnerSpacing).x,
           (double)(pIVar5->ItemInnerSpacing).y);
      if (bVar2) {
        LogText("\n```\n");
        LogFinish();
      }
      EndChildFrame();
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowAboutWindow(bool* p_open)
{
    if (!ImGui::Begin("About Dear ImGui", p_open, ImGuiWindowFlags_AlwaysAutoResize))
    {
        ImGui::End();
        return;
    }
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Separator();
    ImGui::Text("By Omar Cornut and all Dear ImGui contributors.");
    ImGui::Text("Dear ImGui is licensed under the MIT License, see LICENSE for more information.");

    static bool show_config_info = false;
    ImGui::Checkbox("Config/Build Information", &show_config_info);
    if (show_config_info)
    {
        ImGuiIO& io = ImGui::GetIO();
        ImGuiStyle& style = ImGui::GetStyle();

        bool copy_to_clipboard = ImGui::Button("Copy to clipboard");
        ImVec2 child_size = ImVec2(0, ImGui::GetTextLineHeightWithSpacing() * 18);
        ImGui::BeginChildFrame(ImGui::GetID("cfg_infos"), child_size, ImGuiWindowFlags_NoMove);
        if (copy_to_clipboard)
        {
            ImGui::LogToClipboard();
            ImGui::LogText("```\n"); // Back quotes will make text appears without formatting when pasting on GitHub
        }

        ImGui::Text("Dear ImGui %s (%d)", IMGUI_VERSION, IMGUI_VERSION_NUM);
        ImGui::Separator();
        ImGui::Text("sizeof(size_t): %d, sizeof(ImDrawIdx): %d, sizeof(ImDrawVert): %d", (int)sizeof(size_t), (int)sizeof(ImDrawIdx), (int)sizeof(ImDrawVert));
        ImGui::Text("define: __cplusplus=%d", (int)__cplusplus);
#ifdef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_OBSOLETE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_CLIPBOARD_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_DEFAULT_IME_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_WIN32_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_WIN32_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FORMAT_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_MATH_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_FILE_FUNCTIONS
        ImGui::Text("define: IMGUI_DISABLE_FILE_FUNCTIONS");
#endif
#ifdef IMGUI_DISABLE_DEFAULT_ALLOCATORS
        ImGui::Text("define: IMGUI_DISABLE_DEFAULT_ALLOCATORS");
#endif
#ifdef IMGUI_USE_BGRA_PACKED_COLOR
        ImGui::Text("define: IMGUI_USE_BGRA_PACKED_COLOR");
#endif
#ifdef _WIN32
        ImGui::Text("define: _WIN32");
#endif
#ifdef _WIN64
        ImGui::Text("define: _WIN64");
#endif
#ifdef __linux__
        ImGui::Text("define: __linux__");
#endif
#ifdef __APPLE__
        ImGui::Text("define: __APPLE__");
#endif
#ifdef _MSC_VER
        ImGui::Text("define: _MSC_VER=%d", _MSC_VER);
#endif
#ifdef _MSVC_LANG
        ImGui::Text("define: _MSVC_LANG=%d", (int)_MSVC_LANG);
#endif
#ifdef __MINGW32__
        ImGui::Text("define: __MINGW32__");
#endif
#ifdef __MINGW64__
        ImGui::Text("define: __MINGW64__");
#endif
#ifdef __GNUC__
        ImGui::Text("define: __GNUC__=%d", (int)__GNUC__);
#endif
#ifdef __clang_version__
        ImGui::Text("define: __clang_version__=%s", __clang_version__);
#endif
#ifdef IMGUI_HAS_VIEWPORT
        ImGui::Text("define: IMGUI_HAS_VIEWPORT");
#endif
#ifdef IMGUI_HAS_DOCK
        ImGui::Text("define: IMGUI_HAS_DOCK");
#endif
        ImGui::Separator();
        ImGui::Text("io.BackendPlatformName: %s", io.BackendPlatformName ? io.BackendPlatformName : "NULL");
        ImGui::Text("io.BackendRendererName: %s", io.BackendRendererName ? io.BackendRendererName : "NULL");
        ImGui::Text("io.ConfigFlags: 0x%08X", io.ConfigFlags);
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)        ImGui::Text(" NavEnableKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)         ImGui::Text(" NavEnableGamepad");
        if (io.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos)     ImGui::Text(" NavEnableSetMousePos");
        if (io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard)     ImGui::Text(" NavNoCaptureKeyboard");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)                  ImGui::Text(" NoMouse");
        if (io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange)      ImGui::Text(" NoMouseCursorChange");
        if (io.ConfigFlags & ImGuiConfigFlags_DockingEnable)            ImGui::Text(" DockingEnable");
        if (io.ConfigFlags & ImGuiConfigFlags_ViewportsEnable)          ImGui::Text(" ViewportsEnable");
        if (io.ConfigFlags & ImGuiConfigFlags_DpiEnableScaleViewports)  ImGui::Text(" DpiEnableScaleViewports");
        if (io.ConfigFlags & ImGuiConfigFlags_DpiEnableScaleFonts)      ImGui::Text(" DpiEnableScaleFonts");
        if (io.MouseDrawCursor)                                         ImGui::Text("io.MouseDrawCursor");
        if (io.ConfigViewportsNoAutoMerge)                              ImGui::Text("io.ConfigViewportsNoAutoMerge");
        if (io.ConfigViewportsNoTaskBarIcon)                            ImGui::Text("io.ConfigViewportsNoTaskBarIcon");
        if (io.ConfigViewportsNoDecoration)                             ImGui::Text("io.ConfigViewportsNoDecoration");
        if (io.ConfigViewportsNoDefaultParent)                          ImGui::Text("io.ConfigViewportsNoDefaultParent");
        if (io.ConfigDockingNoSplit)                                    ImGui::Text("io.ConfigDockingNoSplit");
        if (io.ConfigDockingWithShift)                                  ImGui::Text("io.ConfigDockingWithShift");
        if (io.ConfigDockingAlwaysTabBar)                               ImGui::Text("io.ConfigDockingAlwaysTabBar");
        if (io.ConfigDockingTransparentPayload)                         ImGui::Text("io.ConfigDockingTransparentPayload");
        if (io.ConfigMacOSXBehaviors)                                   ImGui::Text("io.ConfigMacOSXBehaviors");
        if (io.ConfigInputTextCursorBlink)                              ImGui::Text("io.ConfigInputTextCursorBlink");
        if (io.ConfigWindowsResizeFromEdges)                            ImGui::Text("io.ConfigWindowsResizeFromEdges");
        if (io.ConfigWindowsMoveFromTitleBarOnly)                       ImGui::Text("io.ConfigWindowsMoveFromTitleBarOnly");
        if (io.ConfigMemoryCompactTimer >= 0.0f)                        ImGui::Text("io.ConfigMemoryCompactTimer = %.1f", io.ConfigMemoryCompactTimer);
        ImGui::Text("io.BackendFlags: 0x%08X", io.BackendFlags);
        if (io.BackendFlags & ImGuiBackendFlags_HasGamepad)             ImGui::Text(" HasGamepad");
        if (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors)        ImGui::Text(" HasMouseCursors");
        if (io.BackendFlags & ImGuiBackendFlags_HasSetMousePos)         ImGui::Text(" HasSetMousePos");
        if (io.BackendFlags & ImGuiBackendFlags_PlatformHasViewports)   ImGui::Text(" PlatformHasViewports");
        if (io.BackendFlags & ImGuiBackendFlags_HasMouseHoveredViewport)ImGui::Text(" HasMouseHoveredViewport");
        if (io.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)   ImGui::Text(" RendererHasVtxOffset");
        if (io.BackendFlags & ImGuiBackendFlags_RendererHasViewports)   ImGui::Text(" RendererHasViewports");
        ImGui::Separator();
        ImGui::Text("io.Fonts: %d fonts, Flags: 0x%08X, TexSize: %d,%d", io.Fonts->Fonts.Size, io.Fonts->Flags, io.Fonts->TexWidth, io.Fonts->TexHeight);
        ImGui::Text("io.DisplaySize: %.2f,%.2f", io.DisplaySize.x, io.DisplaySize.y);
        ImGui::Text("io.DisplayFramebufferScale: %.2f,%.2f", io.DisplayFramebufferScale.x, io.DisplayFramebufferScale.y);
        ImGui::Separator();
        ImGui::Text("style.WindowPadding: %.2f,%.2f", style.WindowPadding.x, style.WindowPadding.y);
        ImGui::Text("style.WindowBorderSize: %.2f", style.WindowBorderSize);
        ImGui::Text("style.FramePadding: %.2f,%.2f", style.FramePadding.x, style.FramePadding.y);
        ImGui::Text("style.FrameRounding: %.2f", style.FrameRounding);
        ImGui::Text("style.FrameBorderSize: %.2f", style.FrameBorderSize);
        ImGui::Text("style.ItemSpacing: %.2f,%.2f", style.ItemSpacing.x, style.ItemSpacing.y);
        ImGui::Text("style.ItemInnerSpacing: %.2f,%.2f", style.ItemInnerSpacing.x, style.ItemInnerSpacing.y);

        if (copy_to_clipboard)
        {
            ImGui::LogText("\n```\n");
            ImGui::LogFinish();
        }
        ImGui::EndChildFrame();
    }
    ImGui::End();
}